

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

Roaring * __thiscall roaring::Roaring::operator=(Roaring *this,Roaring *r)

{
  _Bool _Var1;
  runtime_error *this_00;
  roaring_bitmap_t *in_RSI;
  roaring_bitmap_t *in_RDI;
  roaring_bitmap_t *in_stack_ffffffffffffffe0;
  
  _Var1 = roaring_bitmap_overwrite(in_stack_ffffffffffffffe0,in_RDI);
  if (!_Var1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"failed memory alloc in assignment");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _Var1 = roaring_bitmap_get_copy_on_write(in_RSI);
  roaring_bitmap_set_copy_on_write(in_RDI,_Var1);
  return (Roaring *)in_RDI;
}

Assistant:

Roaring &operator=(const Roaring &r) {
        if (!api::roaring_bitmap_overwrite(&roaring, &r.roaring)) {
            ROARING_TERMINATE("failed memory alloc in assignment");
        }
        api::roaring_bitmap_set_copy_on_write(
            &roaring, api::roaring_bitmap_get_copy_on_write(&r.roaring));
        return *this;
    }